

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void ptrmapPutOvflPtr(MemPage *pPage,u8 *pCell,int *pRC)

{
  u32 key;
  undefined1 local_38 [4];
  Pgno ovfl;
  CellInfo info;
  int *pRC_local;
  u8 *pCell_local;
  MemPage *pPage_local;
  
  if ((*pRC == 0) &&
     (info._16_8_ = pRC, (*pPage->xParseCell)(pPage,pCell,(CellInfo *)local_38),
     info.pPayload._4_2_ < (uint)info.pPayload)) {
    key = sqlite3Get4byte(pCell + (int)(info.pPayload._6_2_ - 4));
    ptrmapPut(pPage->pBt,key,'\x03',pPage->pgno,(int *)info._16_8_);
  }
  return;
}

Assistant:

static void ptrmapPutOvflPtr(MemPage *pPage, u8 *pCell, int *pRC){
  CellInfo info;
  if( *pRC ) return;
  assert( pCell!=0 );
  pPage->xParseCell(pPage, pCell, &info);
  if( info.nLocal<info.nPayload ){
    Pgno ovfl = get4byte(&pCell[info.nSize-4]);
    ptrmapPut(pPage->pBt, ovfl, PTRMAP_OVERFLOW1, pPage->pgno, pRC);
  }
}